

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O0

SUNErrCode SUNDataNode_GetChild(SUNDataNode self,sundataindex index,SUNDataNode *child_node)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  SUNErrCode err;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*in_RDI + 0x30) == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDataNode_GetChild(const SUNDataNode self, sundataindex index,
                                SUNDataNode* child_node)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->getchild)
  {
    SUNErrCode err = self->ops->getchild(self, index, child_node);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}